

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall
OpenMD::HBondJumpR::HBondJumpR
          (HBondJumpR *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3
          ,RealType OOcut,RealType thetaCut,RealType OHcut,RealType len,int nRBins)

{
  SelectionEvaluator *this_00;
  pointer pOVar1;
  pointer pcVar2;
  long *plVar3;
  pointer pOVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_88 [24];
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_60;
  SelectionManager *local_58;
  string local_50;
  
  HBondJump::HBondJump(&this->super_HBondJump,info,filename,sele1,sele2,OOcut,thetaCut,OHcut);
  (this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__HBondJumpR_002ef688;
  this->len_ = len;
  this->nRBins_ = nRBins;
  SelectionManager::SelectionManager
            (&this->seleMan3_,(this->super_HBondJump).super_TimeCorrFunc<double>.info_);
  local_68 = &(this->selectionScript3_).field_2;
  (this->selectionScript3_)._M_dataplus._M_p = (pointer)local_68;
  pcVar2 = (sele3->_M_dataplus)._M_p;
  local_58 = &this->seleMan3_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript3_,pcVar2,pcVar2 + sele3->_M_string_length);
  this_00 = &this->evaluator3_;
  SelectionEvaluator::SelectionEvaluator
            (this_00,(this->super_HBondJump).super_TimeCorrFunc<double>.info_);
  (this->rbin_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rbin_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->counts_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->counts_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rbin_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar1 = (pointer)(local_88 + 0x10);
  local_88._0_8_ = pOVar1;
  local_60 = &this->histogram_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"HBondJumpR","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_HBondJump).super_TimeCorrFunc<double>.corrFuncType_);
  if ((pointer)local_88._0_8_ != pOVar1) {
    operator_delete((void *)local_88._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_88._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_50,&(this->super_HBondJump).super_TimeCorrFunc<double>.dumpFilename_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar4 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pOVar4) {
    local_88._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_70 = plVar3[3];
    local_88._0_8_ = pOVar1;
  }
  else {
    local_88._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_88._0_8_ = (pointer)*plVar3;
  }
  local_88._8_8_ = plVar3[1];
  *plVar3 = (long)pOVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
              outputFilename_);
  if ((pointer)local_88._0_8_ != pOVar1) {
    operator_delete((void *)local_88._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_88._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->rbin_,(long)(this->super_HBondJump).super_TimeCorrFunc<double>.nFrames_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->histogram_,(ulong)(this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->counts_,(ulong)(this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_);
  if ((this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_ != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->histogram_).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar6),(ulong)this->nRBins_);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->counts_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar6),(ulong)this->nRBins_);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < (this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_);
  }
  SelectionEvaluator::loadScriptString(this_00,&this->selectionScript3_);
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_88,this_00);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan3_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_88._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_88);
  }
  this->deltaR_ = this->len_ / (double)this->nRBins_;
  return;
}

Assistant:

HBondJumpR::HBondJumpR(SimInfo* info, const std::string& filename,
                         const std::string& sele1, const std::string& sele2,
                         const std::string& sele3, RealType OOcut,
                         RealType thetaCut, RealType OHcut, RealType len,
                         int nRBins) :
      HBondJump(info, filename, sele1, sele2, OOcut, thetaCut, OHcut),
      len_(len), nRBins_(nRBins), seleMan3_(info_), selectionScript3_(sele3),
      evaluator3_(info_) {
    setCorrFuncType("HBondJumpR");
    setOutputName(getPrefix(dumpFilename_) + ".jumpR");

    rbin_.resize(nFrames_);
    histogram_.resize(nTimeBins_);
    counts_.resize(nTimeBins_);
    for (unsigned int i = 0; i < nTimeBins_; i++) {
      histogram_[i].resize(nRBins_);
      counts_[i].resize(nRBins_);
    }

    evaluator3_.loadScriptString(selectionScript3_);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    deltaR_ = len_ / nRBins_;
  }